

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

int __thiscall jrtplib::RTPSession::SetSessionBandwidth(RTPSession *this,double bw)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  int iVar4;
  RTCPSchedulerParams p;
  RTCPSchedulerParams local_38;
  
  iVar4 = -0x3e;
  if (this->created == true) {
    local_38.bandwidth = (this->rtcpsched).schedparams.bandwidth;
    dVar1 = (this->rtcpsched).schedparams.senderfraction;
    dVar2 = (this->rtcpsched).schedparams.mininterval.m_t;
    uVar3._0_1_ = (this->rtcpsched).schedparams.usehalfatstartup;
    uVar3._1_1_ = (this->rtcpsched).schedparams.immediatebye;
    uVar3._2_6_ = *(undefined6 *)&(this->rtcpsched).schedparams.field_0x1a;
    local_38.mininterval.m_t._0_2_ = SUB82(dVar2,0);
    local_38.mininterval.m_t._2_6_ = (undefined6)((ulong)dVar2 >> 0x10);
    local_38._24_2_ = SUB82(uVar3,0);
    local_38.senderfraction._0_2_ = SUB82(dVar1,0);
    local_38.senderfraction._2_6_ = (undefined6)((ulong)dVar1 >> 0x10);
    local_38._26_6_ = uVar3._2_6_;
    iVar4 = RTCPSchedulerParams::SetRTCPBandwidth(&local_38,this->controlfragment * bw);
    if (-1 < iVar4) {
      *(ulong *)((long)&(this->rtcpsched).schedparams.senderfraction + 2) =
           CONCAT26(local_38.mininterval.m_t._0_2_,local_38.senderfraction._2_6_);
      *(ulong *)((long)&(this->rtcpsched).schedparams.mininterval.m_t + 2) =
           CONCAT26(local_38._24_2_,local_38.mininterval.m_t._2_6_);
      (this->rtcpsched).schedparams.bandwidth = local_38.bandwidth;
      (this->rtcpsched).schedparams.senderfraction =
           (double)CONCAT62(local_38.senderfraction._2_6_,local_38.senderfraction._0_2_);
      this->sessionbandwidth = bw;
    }
    RTCPSchedulerParams::~RTCPSchedulerParams(&local_38);
  }
  return iVar4;
}

Assistant:

int RTPSession::SetSessionBandwidth(double bw)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;
	SCHED_LOCK
	RTCPSchedulerParams p = rtcpsched.GetParameters();
	status = p.SetRTCPBandwidth(bw*controlfragment);
	if (status >= 0)
	{
		rtcpsched.SetParameters(p);
		sessionbandwidth = bw;
	}
	SCHED_UNLOCK
	return status;
}